

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::CompilerGLSL::build_workgroup_size
          (CompilerGLSL *this,
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          *arguments,SpecializationConstant *wg_x,SpecializationConstant *wg_y,
          SpecializationConstant *wg_z)

{
  SpecializationConstant *pSVar1;
  uint32_t uVar2;
  SPIRConstant *pSVar3;
  bool local_1d9;
  string local_1d8;
  uint32_t local_1b4;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  uint32_t local_12c;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  uint32_t local_a4;
  string local_a0;
  string local_80;
  string local_60;
  bool local_3a;
  undefined1 local_39;
  bool use_local_size_id;
  SPIREntryPoint *pSStack_38;
  bool builtin_workgroup;
  SPIREntryPoint *execution;
  SpecializationConstant *wg_z_local;
  SpecializationConstant *wg_y_local;
  SpecializationConstant *wg_x_local;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *arguments_local;
  CompilerGLSL *this_local;
  
  execution = (SPIREntryPoint *)wg_z;
  wg_z_local = wg_y;
  wg_y_local = wg_x;
  wg_x_local = (SpecializationConstant *)arguments;
  arguments_local =
       (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        *)this;
  pSStack_38 = Compiler::get_entry_point(&this->super_Compiler);
  local_39 = (pSStack_38->workgroup_size).constant != 0;
  local_1d9 = false;
  if (!(bool)local_39) {
    local_1d9 = Bitset::get(&pSStack_38->flags,0x26);
  }
  local_3a = local_1d9;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)wg_y_local);
  pSVar1 = wg_x_local;
  if (uVar2 == 0) {
    if (((local_3a & 1U) == 0) || ((pSStack_38->workgroup_size).id_x == 0)) {
      join<char_const(&)[16],unsigned_int&>
                (&local_c8,(diligent_spirv_cross *)0xe6f423,
                 (char (*) [16])&pSStack_38->workgroup_size,(uint *)wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)pSVar1,&local_c8);
      ::std::__cxx11::string::~string((string *)&local_c8);
    }
    else {
      pSVar3 = Compiler::get<diligent_spirv_cross::SPIRConstant>
                         (&this->super_Compiler,(pSStack_38->workgroup_size).id_x);
      local_a4 = SPIRConstant::scalar(pSVar3,0,0);
      join<char_const(&)[16],unsigned_int>
                (&local_a0,(diligent_spirv_cross *)0xe6f423,(char (*) [16])&local_a4,(uint *)wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)pSVar1,&local_a0);
      ::std::__cxx11::string::~string((string *)&local_a0);
    }
  }
  else if (((this->options).vulkan_semantics & 1U) == 0) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)wg_y_local);
    pSVar3 = Compiler::get<diligent_spirv_cross::SPIRConstant>(&this->super_Compiler,uVar2);
    join<char_const(&)[16],std::__cxx11::string&>
              (&local_80,(diligent_spirv_cross *)0xe6f423,
               (char (*) [16])&pSVar3->specialization_constant_macro_name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)wg_y);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)pSVar1,&local_80);
    ::std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    join<char_const(&)[19],unsigned_int_const&>
              (&local_60,(diligent_spirv_cross *)"local_size_x_id = ",
               (char (*) [19])&wg_y_local->constant_id,(uint *)wg_y);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)pSVar1,&local_60);
    ::std::__cxx11::string::~string((string *)&local_60);
  }
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)wg_z_local);
  pSVar1 = wg_x_local;
  if (uVar2 == 0) {
    if (((local_3a & 1U) == 0) || ((pSStack_38->workgroup_size).id_y == 0)) {
      join<char_const(&)[16],unsigned_int&>
                (&local_150,(diligent_spirv_cross *)0xe6f435,
                 (char (*) [16])&(pSStack_38->workgroup_size).y,(uint *)wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)pSVar1,&local_150);
      ::std::__cxx11::string::~string((string *)&local_150);
    }
    else {
      pSVar3 = Compiler::get<diligent_spirv_cross::SPIRConstant>
                         (&this->super_Compiler,(pSStack_38->workgroup_size).id_y);
      local_12c = SPIRConstant::scalar(pSVar3,0,0);
      join<char_const(&)[16],unsigned_int>
                (&local_128,(diligent_spirv_cross *)0xe6f435,(char (*) [16])&local_12c,(uint *)wg_y)
      ;
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)pSVar1,&local_128);
      ::std::__cxx11::string::~string((string *)&local_128);
    }
  }
  else if (((this->options).vulkan_semantics & 1U) == 0) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)wg_z_local);
    pSVar3 = Compiler::get<diligent_spirv_cross::SPIRConstant>(&this->super_Compiler,uVar2);
    join<char_const(&)[16],std::__cxx11::string&>
              (&local_108,(diligent_spirv_cross *)0xe6f435,
               (char (*) [16])&pSVar3->specialization_constant_macro_name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)wg_y);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)pSVar1,&local_108);
    ::std::__cxx11::string::~string((string *)&local_108);
  }
  else {
    join<char_const(&)[19],unsigned_int_const&>
              (&local_e8,(diligent_spirv_cross *)"local_size_y_id = ",
               (char (*) [19])&wg_z_local->constant_id,(uint *)wg_y);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)pSVar1,&local_e8);
    ::std::__cxx11::string::~string((string *)&local_e8);
  }
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)execution);
  pSVar1 = wg_x_local;
  if (uVar2 == 0) {
    if (((local_3a & 1U) == 0) || ((pSStack_38->workgroup_size).id_z == 0)) {
      join<char_const(&)[16],unsigned_int&>
                (&local_1d8,(diligent_spirv_cross *)0xe6f447,
                 (char (*) [16])&(pSStack_38->workgroup_size).z,(uint *)wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)pSVar1,&local_1d8);
      ::std::__cxx11::string::~string((string *)&local_1d8);
    }
    else {
      pSVar3 = Compiler::get<diligent_spirv_cross::SPIRConstant>
                         (&this->super_Compiler,(pSStack_38->workgroup_size).id_z);
      local_1b4 = SPIRConstant::scalar(pSVar3,0,0);
      join<char_const(&)[16],unsigned_int>
                (&local_1b0,(diligent_spirv_cross *)0xe6f447,(char (*) [16])&local_1b4,(uint *)wg_y)
      ;
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)pSVar1,&local_1b0);
      ::std::__cxx11::string::~string((string *)&local_1b0);
    }
  }
  else if (((this->options).vulkan_semantics & 1U) == 0) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)execution);
    pSVar3 = Compiler::get<diligent_spirv_cross::SPIRConstant>(&this->super_Compiler,uVar2);
    join<char_const(&)[16],std::__cxx11::string&>
              (&local_190,(diligent_spirv_cross *)0xe6f447,
               (char (*) [16])&pSVar3->specialization_constant_macro_name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)wg_y);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)pSVar1,&local_190);
    ::std::__cxx11::string::~string((string *)&local_190);
  }
  else {
    join<char_const(&)[19],unsigned_int_const&>
              (&local_170,(diligent_spirv_cross *)"local_size_z_id = ",
               (char (*) [19])&execution->field_0x4,(uint *)wg_y);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)pSVar1,&local_170);
    ::std::__cxx11::string::~string((string *)&local_170);
  }
  return;
}

Assistant:

void CompilerGLSL::build_workgroup_size(SmallVector<string> &arguments, const SpecializationConstant &wg_x,
                                        const SpecializationConstant &wg_y, const SpecializationConstant &wg_z)
{
	auto &execution = get_entry_point();
	bool builtin_workgroup = execution.workgroup_size.constant != 0;
	bool use_local_size_id = !builtin_workgroup && execution.flags.get(ExecutionModeLocalSizeId);

	if (wg_x.id)
	{
		if (options.vulkan_semantics)
			arguments.push_back(join("local_size_x_id = ", wg_x.constant_id));
		else
			arguments.push_back(join("local_size_x = ", get<SPIRConstant>(wg_x.id).specialization_constant_macro_name));
	}
	else if (use_local_size_id && execution.workgroup_size.id_x)
		arguments.push_back(join("local_size_x = ", get<SPIRConstant>(execution.workgroup_size.id_x).scalar()));
	else
		arguments.push_back(join("local_size_x = ", execution.workgroup_size.x));

	if (wg_y.id)
	{
		if (options.vulkan_semantics)
			arguments.push_back(join("local_size_y_id = ", wg_y.constant_id));
		else
			arguments.push_back(join("local_size_y = ", get<SPIRConstant>(wg_y.id).specialization_constant_macro_name));
	}
	else if (use_local_size_id && execution.workgroup_size.id_y)
		arguments.push_back(join("local_size_y = ", get<SPIRConstant>(execution.workgroup_size.id_y).scalar()));
	else
		arguments.push_back(join("local_size_y = ", execution.workgroup_size.y));

	if (wg_z.id)
	{
		if (options.vulkan_semantics)
			arguments.push_back(join("local_size_z_id = ", wg_z.constant_id));
		else
			arguments.push_back(join("local_size_z = ", get<SPIRConstant>(wg_z.id).specialization_constant_macro_name));
	}
	else if (use_local_size_id && execution.workgroup_size.id_z)
		arguments.push_back(join("local_size_z = ", get<SPIRConstant>(execution.workgroup_size.id_z).scalar()));
	else
		arguments.push_back(join("local_size_z = ", execution.workgroup_size.z));
}